

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O3

int __thiscall glu::Program::link(Program *this,char *__from,char *__to)

{
  Functions *pFVar1;
  GLenum GVar2;
  deUint64 dVar3;
  deUint64 dVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  deUint32 program;
  int linkStatus;
  string local_48;
  
  (this->m_info).linkOk = false;
  (this->m_info).linkTimeUs = 0;
  (this->m_info).infoLog._M_string_length = 0;
  *(this->m_info).infoLog._M_dataplus._M_p = '\0';
  dVar3 = deGetMicroseconds();
  (*this->m_gl->linkProgram)(this->m_program);
  dVar4 = deGetMicroseconds();
  (this->m_info).linkTimeUs = dVar4 - dVar3;
  GVar2 = (*this->m_gl->getError)();
  checkError(GVar2,"glLinkProgram()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0xef);
  pFVar1 = this->m_gl;
  local_48._M_dataplus._M_p._0_4_ = 0;
  (*pFVar1->getProgramiv)(this->m_program,0x8b82,(GLint *)&local_48);
  GVar2 = (*pFVar1->getError)();
  program = 0x8e;
  checkError(GVar2,"glGetProgramiv()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x8e);
  (this->m_info).linkOk = (int)local_48._M_dataplus._M_p != 0;
  getProgramInfoLog_abi_cxx11_
            (&local_48,(glu *)this->m_gl,(Functions *)(ulong)this->m_program,program);
  std::__cxx11::string::operator=((string *)&this->m_info,(string *)&local_48);
  paVar5 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_48._M_dataplus._M_p._4_4_,(int)local_48._M_dataplus._M_p) != paVar5) {
    operator_delete((undefined1 *)
                    CONCAT44(local_48._M_dataplus._M_p._4_4_,(int)local_48._M_dataplus._M_p),
                    local_48.field_2._M_allocated_capacity + 1);
    paVar5 = extraout_RAX;
  }
  return (int)paVar5;
}

Assistant:

void Program::link (void)
{
	m_info.linkOk		= false;
	m_info.linkTimeUs	= 0;
	m_info.infoLog.clear();

	{
		deUint64 linkStart = deGetMicroseconds();
		m_gl.linkProgram(m_program);
		m_info.linkTimeUs = deGetMicroseconds() - linkStart;
	}
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glLinkProgram()");

	m_info.linkOk	= getProgramLinkStatus(m_gl, m_program);
	m_info.infoLog	= getProgramInfoLog(m_gl, m_program);
}